

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zutil.c
# Opt level: O2

void zCopy_CompCol_Matrix(SuperMatrix *A,SuperMatrix *B)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  undefined8 uVar5;
  Dtype_t DVar6;
  Mtype_t MVar7;
  int_t iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  
  DVar6 = A->Dtype;
  MVar7 = A->Mtype;
  iVar8 = A->nrow;
  B->Stype = A->Stype;
  B->Dtype = DVar6;
  B->Mtype = MVar7;
  B->nrow = iVar8;
  iVar1 = A->ncol;
  B->ncol = iVar1;
  puVar3 = (uint *)A->Store;
  puVar4 = (uint *)B->Store;
  uVar2 = *puVar3;
  *puVar4 = uVar2;
  uVar11 = 0;
  uVar9 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar9 = uVar11;
  }
  for (; uVar9 << 4 != uVar11; uVar11 = uVar11 + 0x10) {
    lVar10 = *(long *)(puVar4 + 2);
    uVar5 = ((undefined8 *)(*(long *)(puVar3 + 2) + uVar11))[1];
    *(undefined8 *)(lVar10 + uVar11) = *(undefined8 *)(*(long *)(puVar3 + 2) + uVar11);
    ((undefined8 *)(lVar10 + uVar11))[1] = uVar5;
  }
  for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
    *(undefined4 *)(*(long *)(puVar4 + 4) + uVar11 * 4) =
         *(undefined4 *)(*(long *)(puVar3 + 4) + uVar11 * 4);
  }
  for (lVar10 = 0; lVar10 <= iVar1; lVar10 = lVar10 + 1) {
    *(undefined4 *)(*(long *)(puVar4 + 6) + lVar10 * 4) =
         *(undefined4 *)(*(long *)(puVar3 + 6) + lVar10 * 4);
  }
  return;
}

Assistant:

void
zCopy_CompCol_Matrix(SuperMatrix *A, SuperMatrix *B)
{
    NCformat *Astore, *Bstore;
    int      ncol, nnz, i;

    B->Stype = A->Stype;
    B->Dtype = A->Dtype;
    B->Mtype = A->Mtype;
    B->nrow  = A->nrow;;
    B->ncol  = ncol = A->ncol;
    Astore   = (NCformat *) A->Store;
    Bstore   = (NCformat *) B->Store;
    Bstore->nnz = nnz = Astore->nnz;
    for (i = 0; i < nnz; ++i)
	((doublecomplex *)Bstore->nzval)[i] = ((doublecomplex *)Astore->nzval)[i];
    for (i = 0; i < nnz; ++i) Bstore->rowind[i] = Astore->rowind[i];
    for (i = 0; i <= ncol; ++i) Bstore->colptr[i] = Astore->colptr[i];
}